

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int param_1,char **argv)

{
  char *__s;
  bool bVar1;
  int c;
  bool result;
  allocator<char> local_159;
  string local_158;
  undefined1 local_138 [8];
  App app;
  char **argv_local;
  int param_0_local;
  
  app.data.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = argv;
  std::__cxx11::string::string((string *)local_138);
  std::__cxx11::string::string((string *)(app.dir.field_2._M_local_buf + 8));
  std::optional<ritobin::BinUnhasher>::optional
            ((optional<ritobin::BinUnhasher> *)((long)&app.error.field_2 + 8));
  std::__cxx11::string::string
            ((string *)
             &app.unhasher.super__Optional_base<ritobin::BinUnhasher,_false,_false>._M_payload.
              super__Optional_payload<ritobin::BinUnhasher,_true,_false,_false>.
              super__Optional_payload_base<ritobin::BinUnhasher>._M_engaged);
  std::__cxx11::string::string((string *)(app.input_filename.field_2._M_local_buf + 8));
  app.output_filename.field_2._8_8_ = 0;
  app.input_format = (DynamicFormat *)0x0;
  app.output_format = (DynamicFormat *)0x0;
  app.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Tp_alloc_type =
       (_Tp_alloc_type)0x0;
  app.data.super__Vector_base<char,_std::allocator<char>_>._M_impl._1_7_ = 0;
  app.data.super__Vector_base<char,_std::allocator<char>_>._M_impl._8_8_ = 0;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&app.output_format);
  __s = *(char **)app.data.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,__s,&local_159);
  App::set_dir_from_apppath((App *)local_138,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  bVar1 = App::run_once((App *)local_138);
  fprintf(_stderr,"Press enter to exit or close this window...\n");
  getc(_stdin);
  App::~App((App *)local_138);
  return (uint)!bVar1;
}

Assistant:

int main(int, char** argv) {
    App app = {};
    app.set_dir_from_apppath(argv[0]);
    bool result = app.run_once();
    fprintf(stderr, "Press enter to exit or close this window...\n");
    [[maybe_unused]] int c = getc(stdin);
    return result ? EXIT_SUCCESS : EXIT_FAILURE;
}